

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMLSParserImpl::DOMLSParserImpl
          (DOMLSParserImpl *this,XMLValidator *valToAdopt,MemoryManager *manager,
          XMLGrammarPool *gramPool)

{
  DOMStringListImpl **ppDVar1;
  DOMStringListImpl *this_00;
  
  AbstractDOMParser::AbstractDOMParser(&this->super_AbstractDOMParser,valToAdopt,manager,gramPool);
  (this->super_AbstractDOMParser).super_XMLDocumentHandler._vptr_XMLDocumentHandler =
       (_func_int **)&PTR__DOMLSParserImpl_0040a630;
  (this->super_AbstractDOMParser).super_XMLErrorReporter._vptr_XMLErrorReporter =
       (_func_int **)&PTR__DOMLSParserImpl_0040a888;
  (this->super_AbstractDOMParser).super_XMLEntityHandler._vptr_XMLEntityHandler =
       (_func_int **)&PTR__DOMLSParserImpl_0040a8b8;
  (this->super_AbstractDOMParser).super_DocTypeHandler._vptr_DocTypeHandler =
       (_func_int **)&PTR__DOMLSParserImpl_0040a900;
  (this->super_AbstractDOMParser).super_PSVIHandler._vptr_PSVIHandler =
       (_func_int **)&PTR__DOMLSParserImpl_0040a9a0;
  (this->super_DOMLSParser)._vptr_DOMLSParser = (_func_int **)&PTR__DOMLSParserImpl_0040a9d8;
  (this->super_DOMConfiguration)._vptr_DOMConfiguration = (_func_int **)&DAT_0040aa98;
  this->fEntityResolver = (DOMLSResourceResolver *)0x0;
  this->fXMLEntityResolver = (XMLEntityResolver *)0x0;
  this->fErrorHandler = (DOMErrorHandler *)0x0;
  this->fFilter = (DOMLSParserFilter *)0x0;
  this->fCharsetOverridesXMLEncoding = true;
  this->fUserAdoptsDocument = false;
  this->fSupportedParameters = (DOMStringListImpl *)0x0;
  this->fFilterAction =
       (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)0x0
  ;
  this->fFilterDelayedTextNodes = (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0;
  this->fWrapNodesInDocumentFragment = (DOMDocumentFragment *)0x0;
  this->fWrapNodesContext = (DOMNode *)0x0;
  ((this->super_AbstractDOMParser).fScanner)->fNormalizeData = false;
  this_00 = (DOMStringListImpl *)
            XMemory::operator_new(0x10,(this->super_AbstractDOMParser).fMemoryManager);
  DOMStringListImpl::DOMStringListImpl(this_00,0x30,manager);
  ppDVar1 = &this->fSupportedParameters;
  *ppDVar1 = this_00;
  DOMStringListImpl::add(this_00,(XMLCh *)XMLUni::fgDOMResourceResolver);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMErrorHandler);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesEntityResolver);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesSchemaExternalSchemaLocation);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesSecurityManager);
  DOMStringListImpl::add(*ppDVar1,L"http://apache.org/xml/properties/scannerName");
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesParserUseDocumentFromImplementation);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMCharsetOverridesXMLEncoding);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMDisallowDoctype);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMIgnoreUnknownCharacterDenormalization);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMNamespaces);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMSupportedMediatypesOnly);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMValidate);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMValidateIfSchema);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMWellFormed);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMCanonicalForm);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMCDATASections);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMCheckCharacterNormalization);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMComments);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMDatatypeNormalization);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMElementContentWhitespace);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMEntities);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMNamespaceDeclarations);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMNormalizeCharacters);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMSchemaLocation);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMSchemaType);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMSplitCDATASections);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgDOMInfoset);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesSchema);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesSchemaFullChecking);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesUserAdoptsDOMDocument);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesLoadExternalDTD);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesLoadSchema);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesContinueAfterFatalError);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesValidationErrorAsFatal);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesCacheGrammarFromParse);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesUseCachedGrammarInParse);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesCalculateSrcOfs);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesStandardUriConformant);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesDOMHasPSVIInfo);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesGenerateSyntheticAnnotations);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesValidateAnnotations);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesIdentityConstraintChecking);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesIgnoreCachedDTD);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesIgnoreAnnotations);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesDisableDefaultEntityResolution);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesSkipDTDValidation);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesDoXInclude);
  DOMStringListImpl::add(*ppDVar1,(XMLCh *)XMLUni::fgXercesHandleMultipleImports);
  AbstractDOMParser::setDoNamespaces(&this->super_AbstractDOMParser,true);
  return;
}

Assistant:

DOMLSParserImpl::DOMLSParserImpl( XMLValidator* const   valToAdopt
                              , MemoryManager* const  manager
                              , XMLGrammarPool* const gramPool) :

AbstractDOMParser(valToAdopt, manager, gramPool)
, fEntityResolver(0)
, fXMLEntityResolver(0)
, fErrorHandler(0)
, fFilter(0)
, fCharsetOverridesXMLEncoding(true)
, fUserAdoptsDocument(false)
, fSupportedParameters(0)
, fFilterAction(0)
, fFilterDelayedTextNodes(0)
, fWrapNodesInDocumentFragment(0)
, fWrapNodesContext(0)
{
    // dom spec has different default from scanner's default, so set explicitly
    getScanner()->setNormalizeData(false);

    fSupportedParameters=new (fMemoryManager) DOMStringListImpl(48, manager);
    fSupportedParameters->add(XMLUni::fgDOMResourceResolver);
    fSupportedParameters->add(XMLUni::fgDOMErrorHandler);
    fSupportedParameters->add(XMLUni::fgXercesEntityResolver);
    fSupportedParameters->add(XMLUni::fgXercesSchemaExternalSchemaLocation);
	fSupportedParameters->add(XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation);
	fSupportedParameters->add(XMLUni::fgXercesSecurityManager);
	fSupportedParameters->add(XMLUni::fgXercesScannerName);
    fSupportedParameters->add(XMLUni::fgXercesParserUseDocumentFromImplementation);
    fSupportedParameters->add(XMLUni::fgDOMCharsetOverridesXMLEncoding);
    fSupportedParameters->add(XMLUni::fgDOMDisallowDoctype);
    fSupportedParameters->add(XMLUni::fgDOMIgnoreUnknownCharacterDenormalization);
    fSupportedParameters->add(XMLUni::fgDOMNamespaces);
    fSupportedParameters->add(XMLUni::fgDOMSupportedMediatypesOnly);
    fSupportedParameters->add(XMLUni::fgDOMValidate);
    fSupportedParameters->add(XMLUni::fgDOMValidateIfSchema);
    fSupportedParameters->add(XMLUni::fgDOMWellFormed);
    fSupportedParameters->add(XMLUni::fgDOMCanonicalForm);
    fSupportedParameters->add(XMLUni::fgDOMCDATASections);
    fSupportedParameters->add(XMLUni::fgDOMCheckCharacterNormalization);
    fSupportedParameters->add(XMLUni::fgDOMComments);
    fSupportedParameters->add(XMLUni::fgDOMDatatypeNormalization);
    fSupportedParameters->add(XMLUni::fgDOMElementContentWhitespace);
    fSupportedParameters->add(XMLUni::fgDOMEntities);
    fSupportedParameters->add(XMLUni::fgDOMNamespaceDeclarations);
    fSupportedParameters->add(XMLUni::fgDOMNormalizeCharacters);
    fSupportedParameters->add(XMLUni::fgDOMSchemaLocation);
    fSupportedParameters->add(XMLUni::fgDOMSchemaType);
    fSupportedParameters->add(XMLUni::fgDOMSplitCDATASections);
    fSupportedParameters->add(XMLUni::fgDOMInfoset);
    fSupportedParameters->add(XMLUni::fgXercesSchema);
    fSupportedParameters->add(XMLUni::fgXercesSchemaFullChecking);
    fSupportedParameters->add(XMLUni::fgXercesUserAdoptsDOMDocument);
    fSupportedParameters->add(XMLUni::fgXercesLoadExternalDTD);
    fSupportedParameters->add(XMLUni::fgXercesLoadSchema);
    fSupportedParameters->add(XMLUni::fgXercesContinueAfterFatalError);
    fSupportedParameters->add(XMLUni::fgXercesValidationErrorAsFatal);
    fSupportedParameters->add(XMLUni::fgXercesCacheGrammarFromParse);
    fSupportedParameters->add(XMLUni::fgXercesUseCachedGrammarInParse);
    fSupportedParameters->add(XMLUni::fgXercesCalculateSrcOfs);
    fSupportedParameters->add(XMLUni::fgXercesStandardUriConformant);
    fSupportedParameters->add(XMLUni::fgXercesDOMHasPSVIInfo);
    fSupportedParameters->add(XMLUni::fgXercesGenerateSyntheticAnnotations);
    fSupportedParameters->add(XMLUni::fgXercesValidateAnnotations);
    fSupportedParameters->add(XMLUni::fgXercesIdentityConstraintChecking);
    fSupportedParameters->add(XMLUni::fgXercesIgnoreCachedDTD);
    fSupportedParameters->add(XMLUni::fgXercesIgnoreAnnotations);
    fSupportedParameters->add(XMLUni::fgXercesDisableDefaultEntityResolution);
    fSupportedParameters->add(XMLUni::fgXercesSkipDTDValidation);
    fSupportedParameters->add(XMLUni::fgXercesDoXInclude);
    fSupportedParameters->add(XMLUni::fgXercesHandleMultipleImports);

    // LSParser by default does namespace processing
    setDoNamespaces(true);
}